

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

void Int24_To_Int16(void *destinationBuffer,int destinationStride,void *sourceBuffer,
                   int sourceStride,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  PaInt16 temp;
  PaInt16 *dest;
  uchar *src;
  PaUtilTriangularDitherGenerator *ditherGenerator_local;
  uint count_local;
  int sourceStride_local;
  void *sourceBuffer_local;
  int destinationStride_local;
  void *destinationBuffer_local;
  
  dest = (PaInt16 *)destinationBuffer;
  src = (uchar *)sourceBuffer;
  count_local = count;
  while (count_local != 0) {
    *dest = *(PaInt16 *)(src + 1);
    src = src + sourceStride * 3;
    dest = dest + destinationStride;
    count_local = count_local - 1;
  }
  return;
}

Assistant:

static void Int24_To_Int16(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    unsigned char *src = (unsigned char*)sourceBuffer;
    PaInt16 *dest = (PaInt16*)destinationBuffer;
    
    PaInt16 temp;

    (void) ditherGenerator; /* unused parameter */
        
    while( count-- )
    {
		
#if defined(PA_LITTLE_ENDIAN)
		/* src[0] is discarded */
        temp = (((PaInt16)src[1]));
        temp = temp | (PaInt16)(((PaInt16)src[2]) << 8);
#elif defined(PA_BIG_ENDIAN)
		/* src[2] is discarded */
        temp = (PaInt16)(((PaInt16)src[0]) << 8);
        temp = temp | (((PaInt16)src[1]));
#endif

        *dest = temp;

        src += sourceStride * 3;
        dest += destinationStride;
    }
}